

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O1

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::PropagateResult(ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *this,PowConstraint *con,double param_2,double param_3,Context ctx)

{
  double dVar1;
  int var;
  int var_00;
  Context ctx_00;
  Context CVar2;
  
  Context::Add(&(con->super_FunctionalConstraint).ctx,ctx);
  var = (con->super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>).
        args_._M_elems[0];
  var_00 = (con->super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>).
           args_._M_elems[1];
  dVar1 = *(double *)(*(long *)(this + 0x40) + (long)var * 8);
  CVar2.value_ = CTX_MIX;
  if (0.0 <= dVar1) {
    if (0.0 <= *(double *)(*(long *)(this + 0x40) + (long)var_00 * 8)) {
      ctx_00.value_ = CTX_POS;
      if (CTX_POS < ctx.value_) {
        ctx_00.value_ = ctx.value_;
      }
    }
    else {
      ctx_00.value_ = CTX_MIX;
      if ((*(double *)(*(long *)(this + 0x58) + (long)var_00 * 8) <= 0.0) &&
         (ctx_00.value_ = ctx.value_, ctx.value_ < CTX_MIX)) {
        ctx_00.value_ = *(CtxVal *)(&DAT_0037f1b0 + (ulong)ctx.value_ * 4);
      }
    }
    if (*(double *)(*(long *)(this + 0x58) + (long)var * 8) <= 1.0) {
      CVar2.value_ = CTX_NEG;
      if ((CTX_POS < ctx.value_) && (CVar2.value_ = ctx.value_, ctx.value_ == CTX_NEG)) {
        CVar2.value_ = CTX_POS;
      }
    }
    else if ((1.0 <= dVar1) && (CVar2.value_ = CTX_POS, CTX_POS < ctx.value_)) {
      CVar2.value_ = ctx.value_;
    }
  }
  else {
    ctx_00.value_ = CTX_MIX;
  }
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)this,var,-INFINITY,INFINITY,ctx_00);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)this,var_00,-INFINITY,INFINITY,CVar2);
  return;
}

Assistant:

void PropagateResult(
      PowConstraint& con, double , double , Context ctx) {
    con.AddContext(ctx);           // merge context
    auto x = con.GetArguments()[0];
    auto y = con.GetArguments()[1];
    Context ctx_x, ctx_y;
    if (MPCD( lb(x) )>=0.0 ) {     // x >= 0
      ctx_x = (MPCD( lb(y) ) >= 0.0)
                  ? +ctx
                  : MPCD( ub(y) ) <= 0.0
                        ? -ctx: Context::CTX_MIX;
      ctx_y = (MPCD( ub(x) ) <= 1.0)  // 0<=x<=1
                  ? -ctx
                  : MPCD( lb(x) ) >= 1.0  // x>=1
                        ? +ctx
                        : Context::CTX_MIX;
    } else {
      ctx_x = ctx_y = Context::CTX_MIX;
    }
    VarArray1 xx {x};
    PropagateResult2Args(xx,
                         MPD( MinusInfty() ), MPD( Infty() ),
                         ctx_x);
    VarArray1 yy {y};
    PropagateResult2Args(yy,
                         MPD( MinusInfty() ), MPD( Infty() ),
                         ctx_y);
  }